

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateArrayIndex(ExpressionEvalContext *ctx,ExprArrayIndex *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  ExprMemoryLiteral *memory;
  ExprBase *pEVar6;
  TypeRef *pTVar7;
  TypeBase *pTVar8;
  ExprBase *pEVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *msg;
  ExprBase *unaff_R12;
  _func_int **pp_Var10;
  _func_int ***ptr;
  longlong result;
  long local_40;
  SynBase *local_38;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 != 0) && ((ctx->stackFrames).data[uVar1 - 1]->targetYield != 0)) {
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar8 = ctx->ctx->typeVoid;
    pEVar6->typeID = 2;
    pEVar6->source = pSVar3;
    pEVar6->type = pTVar8;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229698;
    return pEVar6;
  }
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    memory = (ExprMemoryLiteral *)Evaluate(ctx,expression->value);
    if ((memory != (ExprMemoryLiteral *)0x0) &&
       (pEVar6 = Evaluate(ctx,expression->index), pEVar6 != (ExprBase *)0x0)) {
      bVar4 = TryTakeLong(pEVar6,&local_40);
      if (bVar4) {
        pTVar8 = (memory->super_ExprBase).type;
        if ((pTVar8 == (TypeBase *)0x0) || (pTVar8->typeID != 0x14)) {
          pTVar8 = (TypeBase *)0x0;
        }
        if (pTVar8 != (TypeBase *)0x0) {
          if ((memory->super_ExprBase).typeID != 0xd) {
            __assert_fail("memory",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                          ,0x64e,
                          "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)")
            ;
          }
          pTVar7 = ExpressionContext::GetReferenceType(ctx->ctx,*(TypeBase **)&pTVar8[1].typeIndex);
          unaff_R12 = (ExprBase *)0x0;
          pEVar6 = CreateExtract(ctx,memory,0,&pTVar7->super_TypeBase);
          if (pEVar6 != (ExprBase *)0x0) {
            if (pEVar6->typeID == 9) {
              unaff_R12 = (ExprBase *)0x0;
              Report(ctx,"ERROR: array index of a null array");
            }
            else {
              pEVar9 = CreateExtract(ctx,memory,8,ctx->ctx->typeInt);
              if ((pEVar9 == (ExprBase *)0x0) || (pEVar9->typeID != 6)) {
                pEVar9 = (ExprBase *)0x0;
              }
              if (pEVar9 == (ExprBase *)0x0) {
                unaff_R12 = (ExprBase *)0x0;
              }
              else if ((local_40 < 0) || ((long)pEVar9[1]._vptr_ExprBase <= local_40)) {
                unaff_R12 = (ExprBase *)0x0;
                ReportCritical(ctx,"ERROR: array index out of bounds");
              }
              else {
                if (pEVar6->typeID != 0xc) {
                  __assert_fail("ptr",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                                ,0x662,
                                "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)"
                               );
                }
                pp_Var10 = (_func_int **)
                           (local_40 * *(long *)(*(long *)&pTVar8[1].typeIndex + 0x30) +
                           (long)pEVar6[1]._vptr_ExprBase);
                pAVar2 = ctx->ctx->allocator;
                iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x40);
                local_38 = (expression->super_ExprBase).source;
                pTVar7 = ExpressionContext::GetReferenceType
                                   (ctx->ctx,*(TypeBase **)&pTVar8[1].typeIndex);
                ExprPointerLiteral::ExprPointerLiteral
                          ((ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar5),local_38,
                           &pTVar7->super_TypeBase,(uchar *)pp_Var10,
                           (uchar *)((long)pp_Var10 +
                                    *(long *)(*(long *)&pTVar8[1].typeIndex + 0x30)));
                unaff_R12 = CheckType(&expression->super_ExprBase,
                                      (ExprBase *)CONCAT44(extraout_var_00,iVar5));
              }
            }
          }
        }
        if (pTVar8 != (TypeBase *)0x0) {
          return unaff_R12;
        }
        pTVar8 = (memory->super_ExprBase).type;
        if ((pTVar8 == (TypeBase *)0x0) || (pTVar8->typeID != 0x12)) {
          pTVar8 = (TypeBase *)0x0;
        }
        if (pTVar8 == (TypeBase *)0x0) {
          __assert_fail("refType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x66d,
                        "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)");
        }
        pp_Var10 = pTVar8[1]._vptr_TypeBase;
        if ((pp_Var10 == (_func_int **)0x0) || (*(int *)(pp_Var10 + 1) != 0x13)) {
          pp_Var10 = (_func_int **)0x0;
        }
        if (pp_Var10 == (_func_int **)0x0) {
          __assert_fail("arrayType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x671,
                        "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)");
        }
        if ((memory->super_ExprBase).typeID != 9) {
          if ((local_40 < 0) || ((long)pp_Var10[0xd] <= local_40)) {
            ReportCritical(ctx,"ERROR: array index out of bounds");
            return (ExprBase *)0x0;
          }
          if ((memory->super_ExprBase).typeID != 0xc) {
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                          ,0x67b,
                          "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)")
            ;
          }
          ptr = (_func_int ***)
                ((long)&(memory->ptr->super_ExprBase)._vptr_ExprBase +
                local_40 * *(long *)(pp_Var10[0xc] + 0x30));
          if ((_func_int **)((long)ptr + *(long *)(pp_Var10[0xc] + 0x30)) <=
              memory[1].super_ExprBase._vptr_ExprBase) {
            pAVar2 = ctx->ctx->allocator;
            iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x40);
            pSVar3 = (expression->super_ExprBase).source;
            pTVar7 = ExpressionContext::GetReferenceType(ctx->ctx,(TypeBase *)pp_Var10[0xc]);
            ExprPointerLiteral::ExprPointerLiteral
                      ((ExprPointerLiteral *)CONCAT44(extraout_var_01,iVar5),pSVar3,
                       &pTVar7->super_TypeBase,(uchar *)ptr,
                       (uchar *)((long)ptr + *(long *)(pp_Var10[0xc] + 0x30)));
            pEVar6 = CheckType(&expression->super_ExprBase,
                               (ExprBase *)CONCAT44(extraout_var_01,iVar5));
            return pEVar6;
          }
          __assert_fail("ptr->ptr + result * arrayType->subType->size + arrayType->subType->size <= ptr->end"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x67c,
                        "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)");
        }
        msg = "ERROR: array index of a null array";
      }
      else {
        msg = "ERROR: failed to evaluate array index";
      }
      Report(ctx,msg);
      return (ExprBase *)0x0;
    }
  }
  else {
    Report(ctx,"ERROR: instruction limit reached");
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateArrayIndex(ExpressionEvalContext &ctx, ExprArrayIndex *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	ExprBase *index = Evaluate(ctx, expression->index);

	if(!index)
		return NULL;

	long long result;
	if(!TryTakeLong(index, result))
		return Report(ctx, "ERROR: failed to evaluate array index");

	if(TypeUnsizedArray *arrayType = getType<TypeUnsizedArray>(value->type))
	{
		ExprMemoryLiteral *memory = getType<ExprMemoryLiteral>(value);

		assert(memory);

		ExprBase *value = CreateExtract(ctx, memory, 0, ctx.ctx.GetReferenceType(arrayType->subType));

		if(!value)
			return NULL;

		if(isType<ExprNullptrLiteral>(value))
			return Report(ctx, "ERROR: array index of a null array");

		ExprIntegerLiteral *size = getType<ExprIntegerLiteral>(CreateExtract(ctx, memory, sizeof(void*), ctx.ctx.typeInt));

		if(!size)
			return NULL;

		if(result < 0 || result >= size->value)
			return ReportCritical(ctx, "ERROR: array index out of bounds");

		ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

		assert(ptr);

		unsigned char *targetPtr = ptr->ptr + result * arrayType->subType->size;

		ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

		return CheckType(expression, shifted);
	}

	TypeRef *refType = getType<TypeRef>(value->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	if(isType<ExprNullptrLiteral>(value))
		return Report(ctx, "ERROR: array index of a null array");

	if(result < 0 || result >= arrayType->length)
		return ReportCritical(ctx, "ERROR: array index out of bounds");

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

	assert(ptr);
	assert(ptr->ptr + result * arrayType->subType->size + arrayType->subType->size <= ptr->end);

	unsigned char *targetPtr = ptr->ptr + result * arrayType->subType->size;

	ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

	return CheckType(expression, shifted);
}